

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

int add_pending_write_callback(CMConnection conn,CMWriteCallbackFunc handler,void *client_data)

{
  ulong uVar1;
  CMConnHandlerList ptr;
  CMConnHandlerList p_Var2;
  ulong uVar3;
  ulong uVar4;
  
  ptr = conn->write_callbacks;
  if (ptr == (CMConnHandlerList)0x0) {
    ptr = (CMConnHandlerList)INT_CMmalloc(0x10);
    conn->write_callbacks = ptr;
    conn->write_callback_len = 1;
    uVar4 = 0;
  }
  else {
    uVar1 = conn->write_callback_len;
    uVar4 = uVar1;
    if (uVar1 != 0) {
      uVar3 = 0;
      p_Var2 = ptr;
      do {
        uVar4 = uVar3;
        if (p_Var2->func == (CMCloseHandlerFunc)0x0) break;
        uVar3 = uVar3 + 1;
        p_Var2 = p_Var2 + 1;
        uVar4 = uVar1;
      } while (uVar1 != uVar3);
    }
    uVar3 = (ulong)((int)uVar4 + 1);
    if (uVar1 < uVar3) {
      ptr = (CMConnHandlerList)INT_CMrealloc(ptr,uVar3 << 4);
      conn->write_callbacks = ptr;
      conn->write_callback_len = uVar3;
    }
  }
  ptr[uVar4 & 0xffffffff].func = handler;
  ptr[uVar4 & 0xffffffff].client_data = client_data;
  return (int)uVar4;
}

Assistant:

static int
 add_pending_write_callback(CMConnection conn, CMWriteCallbackFunc handler, 
			    void* client_data)
 {
     int count = 0;
     while (conn->write_callbacks && count < conn->write_callback_len &&
	    (conn->write_callbacks[count].func != NULL)) count++;
     if (count + 1 > conn->write_callback_len) {
	 if (conn->write_callbacks == NULL) {
	     conn->write_callbacks = malloc(sizeof(conn->write_callbacks[0]));
	     conn->write_callback_len = 1;
	 } else {
	     conn->write_callbacks = 
		 realloc(conn->write_callbacks,
			 sizeof(conn->write_callbacks[0])*(count+1));
	     conn->write_callback_len = count+1;
	 }
     }
     conn->write_callbacks[count].func = handler;
     conn->write_callbacks[count].client_data = client_data;
     return count;
 }